

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

statement_ptr __thiscall
mjs::parser::make_statement<mjs::break_statement,std::__cxx11::wstring>
          (parser *this,
          basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *args)

{
  break_statement *this_00;
  wstring *in_RDX;
  source_extend local_40;
  undefined1 local_21;
  wstring *local_20;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *args_local;
  parser *this_local;
  statement_ptr *s;
  
  args_local = args;
  this_local = this;
  if (args[3].field_2._M_allocated_capacity == 0) {
    __assert_fail("statement_pos_",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp"
                  ,0x147,
                  "statement_ptr mjs::parser::make_statement(Args &&...) [T = mjs::break_statement, Args = <std::basic_string<wchar_t>>]"
                 );
  }
  local_21 = 0;
  local_20 = in_RDX;
  this_00 = (break_statement *)operator_new(0x40);
  position_stack_node::extend
            (&local_40,(position_stack_node *)args[3].field_2._M_allocated_capacity);
  break_statement::break_statement(this_00,&local_40,local_20);
  std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>::
  unique_ptr<std::default_delete<mjs::statement>,void>
            ((unique_ptr<mjs::statement,std::default_delete<mjs::statement>> *)this,(pointer)this_00
            );
  source_extend::~source_extend(&local_40);
  return (__uniq_ptr_data<mjs::statement,_std::default_delete<mjs::statement>,_true,_true>)
         (__uniq_ptr_data<mjs::statement,_std::default_delete<mjs::statement>,_true,_true>)this;
}

Assistant:

statement_ptr make_statement(Args&&... args) {
        assert(statement_pos_);
        auto s = statement_ptr{new T{statement_pos_->extend(), std::forward<Args>(args)...}};
#ifdef PARSER_DEBUG
        std::wcout << s->extend() << " Producting: " << *s << "\n";
#endif
        return s;
    }